

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webclient.cpp
# Opt level: O2

request * warhawk::common::request::default_post
                    (request *__return_storage_ptr__,string *url_,string *data_)

{
  request(__return_storage_ptr__);
  std::__cxx11::string::assign((char *)&__return_storage_ptr__->m_method);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)url_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->m_data,(string *)data_);
  __return_storage_ptr__->m_follow_redirect = true;
  return __return_storage_ptr__;
}

Assistant:

request request::default_post( std::string url_, std::string data_ )
{
  request r;
  r.m_method = "POST";
  r.m_url = std::move( url_ );
  r.m_data = std::move( data_ );
  r.m_follow_redirect = true;
  return r;
}